

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O0

void __thiscall v_array<int>::clear(v_array<int> *this)

{
  long lVar1;
  long *in_RDI;
  int *item;
  size_t in_stack_000001d8;
  v_array<int> *in_stack_000001e0;
  long local_10;
  
  lVar1 = in_RDI[3];
  in_RDI[3] = lVar1 + 1U;
  if ((lVar1 + 1U & 0xfffffffffffffc00) != 0) {
    resize(in_stack_000001e0,in_stack_000001d8);
    in_RDI[3] = 0;
  }
  for (local_10 = *in_RDI; local_10 != in_RDI[1]; local_10 = local_10 + 4) {
  }
  in_RDI[1] = *in_RDI;
  return;
}

Assistant:

void clear()
  {
    if (++erase_count & erase_point)
    {
      resize(_end - _begin);
      erase_count = 0;
    }
    for (T* item = _begin; item != _end; ++item) item->~T();
    _end = _begin;
  }